

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O2

void __thiscall
OpenMD::DataStorage::internalResize<double>
          (DataStorage *this,vector<double,_std::allocator<double>_> *v,size_t newSize)

{
  pointer pdVar1;
  const_iterator __last;
  difference_type __d;
  ulong uVar2;
  size_type __n;
  value_type_conflict2 local_8;
  
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  __last._M_current =
       (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar2 = (long)__last._M_current - (long)pdVar1 >> 3;
  __n = newSize - uVar2;
  if (__n != 0) {
    if (newSize < uVar2 || __n == 0) {
      std::vector<double,_std::allocator<double>_>::erase
                (v,(const_iterator)(pdVar1 + newSize),__last);
      return;
    }
    local_8 = 0.0;
    std::vector<double,_std::allocator<double>_>::insert(v,__last,__n,&local_8);
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }